

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastInt64ToBufferLeft(int64 i,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt64ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  if ((ulong)i >> 0x20 == 0) {
    pcVar1 = FastUInt32ToBufferLeft((uint32)i,buffer);
    return pcVar1;
  }
  pcVar1 = FastUInt64ToBufferLeft((ulong)i / 1000000000,buffer);
  uVar2 = (uint32)i + (int)((ulong)i / 1000000000) * -1000000000;
  *(undefined2 *)pcVar1 = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar2 / 10000000) * 2);
  uVar2 = uVar2 % 10000000;
  uVar3 = uVar2 >> 5;
  *(undefined2 *)(pcVar1 + 2) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar3 / 0xc35) * 2);
  uVar2 = (uVar3 / 0xc35) * -100000 + uVar2;
  *(undefined2 *)(pcVar1 + 4) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar2 / 1000) * 2);
  uVar2 = uVar2 % 1000;
  *(undefined2 *)(pcVar1 + 6) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar2 / 10) * 2);
  pcVar1[8] = (char)(uVar2 / 10) * -10 + (char)uVar2 + '0';
  pcVar1[9] = '\0';
  return pcVar1 + 9;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}